

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O3

void __thiscall
QGuiApplicationPrivate::handlePaletteChanged(QGuiApplicationPrivate *this,char *className)

{
  long in_FS_OFFSET;
  undefined1 *local_28;
  QPalette *pQStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (className == (char *)0x0) {
    local_28 = (undefined1 *)0x0;
    pQStack_20 = app_pal;
    QMetaObject::activate(QCoreApplication::self,&QGuiApplication::staticMetaObject,0xc,&local_28);
  }
  if (((char)QCoreApplicationPrivate::is_app_running == '\x01') &&
     ((char)QCoreApplicationPrivate::is_app_closing == '\0')) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_20 = (QPalette *)&DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_28,ApplicationPaletteChange);
    QCoreApplication::sendEvent(QCoreApplication::self,(QEvent *)&local_28);
    QEvent::~QEvent((QEvent *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::handlePaletteChanged(const char *className)
{
#if QT_DEPRECATED_SINCE(6, 0)
    if (!className) {
        Q_ASSERT(app_pal);
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
        emit qGuiApp->paletteChanged(*QGuiApplicationPrivate::app_pal);
QT_WARNING_POP
    }
#else
    Q_UNUSED(className);
#endif // QT_DEPRECATED_SINCE(6, 0)

    if (is_app_running && !is_app_closing) {
        QEvent event(QEvent::ApplicationPaletteChange);
        QGuiApplication::sendEvent(qGuiApp, &event);
    }
}